

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

string * __thiscall
diligent_spirv_cross::Compiler::get_block_fallback_name_abi_cxx11_
          (string *__return_storage_ptr__,Compiler *this,VariableID id)

{
  pointer pcVar1;
  SPIRVariable *pSVar2;
  string *psVar3;
  SPIRType *pSVar4;
  TypedID<(diligent_spirv_cross::Types)2> *in_R9;
  uint32_t local_2c;
  
  local_2c = id.id;
  pSVar2 = Variant::get<diligent_spirv_cross::SPIRVariable>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + id.id);
  psVar3 = ParsedIR::get_name_abi_cxx11_(&this->ir,(ID)id.id);
  if (psVar3->_M_string_length == 0) {
    pSVar4 = Variant::get<diligent_spirv_cross::SPIRType>
                       ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                        *(uint *)&(pSVar2->super_IVariant).field_0xc);
    join<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const&,char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>&>
              (__return_storage_ptr__,(diligent_spirv_cross *)0x6faf1e,
               (char (*) [2])&(pSVar4->super_IVariant).self,
               (TypedID<(diligent_spirv_cross::Types)0> *)0x6faf1e,(char (*) [2])&local_2c,in_R9);
  }
  else {
    psVar3 = ParsedIR::get_name_abi_cxx11_(&this->ir,(ID)id.id);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string Compiler::get_block_fallback_name(VariableID id) const
{
	auto &var = get<SPIRVariable>(id);
	if (get_name(id).empty())
		return join("_", get<SPIRType>(var.basetype).self, "_", id);
	else
		return get_name(id);
}